

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void __thiscall
cppcms::http::context::submit_to_asynchronous_application
          (context *this,intrusive_ptr<cppcms::application> *app,string *matched)

{
  int iVar1;
  undefined4 extraout_var;
  callable<void_()> *this_00;
  intrusive_ptr<booster::callable<void_()>_> local_108;
  dispatch_binder bd;
  dispatch_binder local_b8;
  dispatch_binder local_70;
  
  bd.dispatch = dispatch;
  std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::http::context,void>
            ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)&bd.ctx,
             (__weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)this);
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr(&bd.app,app);
  std::__cxx11::string::string((string *)&bd.matched,(string *)matched);
  bd.flag = false;
  iVar1 = (*((this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0xc])();
  anon_unknown_3::dispatch_binder::dispatch_binder(&local_b8,&bd);
  this_00 = (callable<void_()> *)operator_new(0x58);
  anon_unknown_3::dispatch_binder::dispatch_binder(&local_70,&local_b8);
  booster::callable<void_()>::callable(this_00);
  (this_00->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__callable_impl_002b3668;
  anon_unknown_3::dispatch_binder::dispatch_binder((dispatch_binder *)(this_00 + 1),&local_70);
  local_108.p_ = this_00;
  booster::atomic_counter::inc();
  anon_unknown_3::dispatch_binder::~dispatch_binder(&local_70);
  booster::aio::io_service::post((callback *)CONCAT44(extraout_var,iVar1));
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_108);
  anon_unknown_3::dispatch_binder::~dispatch_binder(&local_b8);
  anon_unknown_3::dispatch_binder::~dispatch_binder(&bd);
  return;
}

Assistant:

void context::submit_to_asynchronous_application(booster::intrusive_ptr<application> app,std::string const &matched)
{
	dispatch_binder bd = { &context::dispatch, self(), app,matched,false };
	conn_->get_io_service().post(bd);
}